

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O2

void * lzham::task_pool::thread_func(void *pContext)

{
  bool bVar1;
  __pid_t _Var2;
  task tsk;
  
  tsk.field_2._0_4_ = 0;
  tsk._20_8_ = 0;
  tsk.m_data = 0;
  tsk.m_pData_ptr._0_4_ = 0;
  tsk.m_pData_ptr._4_4_ = 0;
  while( true ) {
    _Var2 = semaphore::wait((semaphore *)((long)pContext + 0xa18),(void *)0xffffffff);
    if (((char)_Var2 == '\0') || (*(long *)((long)pContext + 0xa48) != 0)) break;
    bVar1 = tsstack<lzham::task_pool::task,_64U>::pop
                      ((tsstack<lzham::task_pool::task,_64U> *)pContext,&tsk);
    if (bVar1) {
      process_task((task_pool *)pContext,&tsk);
    }
  }
  return (void *)0x0;
}

Assistant:

void * task_pool::thread_func(void *pContext)
   {
      task_pool* pPool = static_cast<task_pool*>(pContext);
      task tsk;

      for ( ; ; )
      {
         if (!pPool->m_tasks_available.wait())
            break;

         if (pPool->m_exit_flag)
            break;

         if (pPool->m_task_stack.pop(tsk))
         {
            pPool->process_task(tsk);
         }
      }

      return NULL;
   }